

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qkmsdevice.cpp
# Opt level: O3

void __thiscall QKmsDevice::~QKmsDevice(QKmsDevice *this)

{
  Data *pDVar1;
  
  this->_vptr_QKmsDevice = (_func_int **)&PTR__QKmsDevice_00125460;
  threadLocalAtomicReset(this);
  QArrayDataPointer<QKmsPlane>::~QArrayDataPointer(&(this->m_planes).d);
  QThreadStorageData::~QThreadStorageData(&(this->m_atomicReqs).d);
  pDVar1 = (this->m_path).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_path).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

QKmsDevice::~QKmsDevice()
{
#if QT_CONFIG(drm_atomic)
    threadLocalAtomicReset();
#endif
}